

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to8.h
# Opt level: O3

void ncnn::im2col_sgemm_pack1to8_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int *piVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  uint uVar19;
  _func_int ***ppp_Var20;
  undefined4 *puVar21;
  ulong uVar22;
  uint uVar23;
  int nn;
  int iVar24;
  ulong uVar25;
  long lVar26;
  undefined4 *puVar27;
  void **ppvVar28;
  uint uVar29;
  ulong uVar30;
  float *pfVar31;
  char cVar32;
  uint uVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  long lVar36;
  undefined1 (*pauVar37) [32];
  undefined4 *puVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  float zeros [8];
  undefined1 local_b8 [64];
  size_t local_78;
  ulong local_70;
  Mat *local_68;
  Allocator *local_60;
  void *local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar5 = bottom_im2col->w;
  uVar25 = (ulong)(int)uVar5;
  iVar24 = bottom_im2col->h;
  uVar29 = bottom_im2col->c;
  uVar22 = (ulong)uVar29;
  local_70 = (ulong)(uint)top_blob->c;
  local_78 = 0;
  local_b8._0_8_ = (Allocator *)0x0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 0;
  local_b8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_b8._24_4_ = 0;
  local_b8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if ((long)uVar25 < 8) {
    uVar19 = uVar5;
    iVar39 = iVar24;
    if (3 < (int)uVar5) {
      iVar39 = iVar24 * 4;
      uVar19 = (uVar5 & 3) + 1;
    }
  }
  else {
    uVar19 = (uVar5 & 3) + (uVar5 >> 3) + (uint)((uVar5 >> 2 & 1) != 0);
    iVar39 = iVar24 * 8;
  }
  local_b8._32_8_ = local_b8._0_8_;
  local_b8._40_4_ = local_b8._8_4_;
  local_b8._44_4_ = local_b8._12_4_;
  local_68 = _bias;
  Mat::create((Mat *)local_b8,iVar39,uVar29,uVar19,4,1,(Allocator *)opt);
  uVar19 = (int)uVar5 >> 3;
  if (0 < (int)uVar19) {
    lVar26 = 0;
    uVar30 = 0;
    do {
      if (0 < (int)uVar29) {
        ppp_Var20 = (_func_int ***)
                    ((long)(_func_int ***)local_b8._0_8_ + local_78 * uVar30 * local_b8._16_8_);
        uVar34 = 0;
        do {
          if (0 < iVar24) {
            pauVar37 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar34 + lVar26);
            iVar39 = iVar24;
            do {
              *(undefined1 (*) [32])ppp_Var20 = *pauVar37;
              ppp_Var20 = ppp_Var20 + 4;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + (ulong)uVar5 * 4);
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar34 = uVar34 + 1;
        } while (uVar34 != uVar22);
      }
      uVar30 = uVar30 + 1;
      lVar26 = lVar26 + 0x20;
    } while (uVar30 != uVar19);
  }
  uVar23 = uVar5 >> 2 & 1;
  if ((uVar23 != 0) && (0 < (int)uVar29)) {
    ppp_Var20 = (_func_int ***)
                ((long)(_func_int ***)local_b8._0_8_ +
                (long)(int)uVar19 * local_78 * local_b8._16_8_);
    uVar30 = 0;
    do {
      if (0 < iVar24) {
        pauVar35 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar30 +
                   (uVar25 & 0xfffffffffffffff8) * 4);
        iVar39 = iVar24;
        do {
          *(undefined1 (*) [16])ppp_Var20 = *pauVar35;
          ppp_Var20 = ppp_Var20 + 2;
          pauVar35 = (undefined1 (*) [16])(*pauVar35 + uVar25 * 4);
          iVar39 = iVar39 + -1;
        } while (iVar39 != 0);
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != uVar22);
  }
  iVar39 = (int)(uVar25 & 0xfffffffffffffff8) + uVar23 * 4;
  if (iVar39 < (int)uVar5) {
    local_60 = (Allocator *)local_b8._0_8_;
    lVar26 = (long)iVar39;
    puVar21 = (undefined4 *)(lVar26 * 4 + (long)bottom_im2col->data);
    sVar6 = bottom_im2col->cstep;
    sVar7 = bottom_im2col->elemsize;
    do {
      if (0 < (int)uVar29) {
        uVar19 = (uint)lVar26;
        uVar23 = uVar19 + 3;
        if (-1 < (int)uVar19) {
          uVar23 = uVar19;
        }
        uVar33 = uVar19 + 7;
        if (-1 < (int)uVar19) {
          uVar33 = uVar19;
        }
        cVar32 = (char)lVar26 - ((byte)uVar33 & 0xf8);
        ppp_Var20 = (_func_int ***)
                    ((long)(_func_int ***)local_b8._0_8_ +
                    (long)(int)((int)((char)(((byte)(cVar32 >> 7) >> 6) + cVar32) >> 2) +
                               ((int)uVar33 >> 3) + (uVar19 - (uVar23 & 0xfffffffc))) *
                    local_78 * local_b8._16_8_);
        uVar30 = 0;
        puVar27 = puVar21;
        do {
          puVar38 = puVar27;
          iVar39 = iVar24;
          if (0 < iVar24) {
            do {
              *(undefined4 *)ppp_Var20 = *puVar38;
              ppp_Var20 = (_func_int ***)((long)ppp_Var20 + 4);
              puVar38 = puVar38 + uVar25;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar30 = uVar30 + 1;
          puVar27 = (undefined4 *)((long)puVar27 + sVar6 * sVar7);
        } while (uVar30 != uVar22);
      }
      lVar26 = lVar26 + 1;
      puVar21 = puVar21 + 1;
    } while (lVar26 < (long)uVar25);
  }
  if (0 < (int)local_70) {
    iVar24 = iVar24 * uVar29;
    uVar22 = 0;
    do {
      pauVar37 = (undefined1 (*) [32])
                 (top_blob->cstep * uVar22 * top_blob->elemsize + (long)top_blob->data);
      ppvVar28 = &local_68->data + uVar22 * 4;
      if (local_68 == (Mat *)0x0) {
        ppvVar28 = &local_58;
      }
      local_58 = (void *)0x0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar5 < 8) {
        uVar30 = 0;
      }
      else {
        lVar26 = 0;
        uVar34 = 0;
        do {
          auVar51 = *(undefined1 (*) [32])ppvVar28;
          auVar49 = auVar51;
          auVar47 = auVar51;
          auVar54 = auVar51;
          auVar53 = auVar51;
          auVar52 = auVar51;
          auVar45 = auVar51;
          auVar42 = auVar51;
          if (0 < iVar24) {
            lVar36 = local_78 * local_b8._16_8_ * lVar26;
            lVar40 = 0;
            iVar39 = iVar24;
            auVar50 = auVar51;
            auVar48 = auVar51;
            auVar46 = auVar51;
            auVar43 = auVar51;
            auVar44 = auVar51;
            auVar16 = auVar51;
            auVar17 = auVar51;
            auVar18 = auVar51;
            do {
              pfVar31 = (float *)((long)kernel->data +
                                 lVar40 + kernel->cstep * uVar22 * kernel->elemsize);
              fVar3 = *pfVar31;
              fVar4 = pfVar31[1];
              fVar8 = pfVar31[2];
              fVar9 = pfVar31[3];
              fVar10 = pfVar31[4];
              fVar11 = pfVar31[5];
              fVar12 = pfVar31[6];
              fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar40 + lVar36);
              fVar2 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar40 + lVar36 + 4);
              auVar54._0_4_ = fVar1 * fVar3 + auVar18._0_4_;
              auVar54._4_4_ = fVar1 * fVar4 + auVar18._4_4_;
              auVar54._8_4_ = fVar1 * fVar8 + auVar18._8_4_;
              auVar54._12_4_ = fVar1 * fVar9 + auVar18._12_4_;
              auVar54._16_4_ = fVar1 * fVar10 + auVar18._16_4_;
              auVar54._20_4_ = fVar1 * fVar11 + auVar18._20_4_;
              auVar54._24_4_ = fVar1 * fVar12 + auVar18._24_4_;
              auVar54._28_4_ = fVar1 + auVar18._28_4_;
              auVar53._0_4_ = fVar2 * fVar3 + auVar17._0_4_;
              auVar53._4_4_ = fVar2 * fVar4 + auVar17._4_4_;
              auVar53._8_4_ = fVar2 * fVar8 + auVar17._8_4_;
              auVar53._12_4_ = fVar2 * fVar9 + auVar17._12_4_;
              auVar53._16_4_ = fVar2 * fVar10 + auVar17._16_4_;
              auVar53._20_4_ = fVar2 * fVar11 + auVar17._20_4_;
              auVar53._24_4_ = fVar2 * fVar12 + auVar17._24_4_;
              auVar53._28_4_ = fVar1 + auVar17._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                                lVar40 + lVar36);
              fVar2 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                                lVar40 + lVar36 + 4);
              auVar52._0_4_ = fVar1 * fVar3 + auVar16._0_4_;
              auVar52._4_4_ = fVar1 * fVar4 + auVar16._4_4_;
              auVar52._8_4_ = fVar1 * fVar8 + auVar16._8_4_;
              auVar52._12_4_ = fVar1 * fVar9 + auVar16._12_4_;
              auVar52._16_4_ = fVar1 * fVar10 + auVar16._16_4_;
              auVar52._20_4_ = fVar1 * fVar11 + auVar16._20_4_;
              auVar52._24_4_ = fVar1 * fVar12 + auVar16._24_4_;
              auVar52._28_4_ = fVar1 + auVar16._28_4_;
              auVar51._0_4_ = fVar2 * fVar3 + auVar46._0_4_;
              auVar51._4_4_ = fVar2 * fVar4 + auVar46._4_4_;
              auVar51._8_4_ = fVar2 * fVar8 + auVar46._8_4_;
              auVar51._12_4_ = fVar2 * fVar9 + auVar46._12_4_;
              auVar51._16_4_ = fVar2 * fVar10 + auVar46._16_4_;
              auVar51._20_4_ = fVar2 * fVar11 + auVar46._20_4_;
              auVar51._24_4_ = fVar2 * fVar12 + auVar46._24_4_;
              auVar51._28_4_ = fVar1 + auVar46._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x10))->_vptr_Allocator +
                                lVar40 + lVar36);
              fVar2 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x10))->_vptr_Allocator +
                                lVar40 + lVar36 + 4);
              auVar49._0_4_ = fVar1 * fVar3 + auVar48._0_4_;
              auVar49._4_4_ = fVar1 * fVar4 + auVar48._4_4_;
              auVar49._8_4_ = fVar1 * fVar8 + auVar48._8_4_;
              auVar49._12_4_ = fVar1 * fVar9 + auVar48._12_4_;
              auVar49._16_4_ = fVar1 * fVar10 + auVar48._16_4_;
              auVar49._20_4_ = fVar1 * fVar11 + auVar48._20_4_;
              auVar49._24_4_ = fVar1 * fVar12 + auVar48._24_4_;
              auVar49._28_4_ = fVar1 + auVar48._28_4_;
              auVar47._0_4_ = fVar2 * fVar3 + auVar50._0_4_;
              auVar47._4_4_ = fVar2 * fVar4 + auVar50._4_4_;
              auVar47._8_4_ = fVar2 * fVar8 + auVar50._8_4_;
              auVar47._12_4_ = fVar2 * fVar9 + auVar50._12_4_;
              auVar47._16_4_ = fVar2 * fVar10 + auVar50._16_4_;
              auVar47._20_4_ = fVar2 * fVar11 + auVar50._20_4_;
              auVar47._24_4_ = fVar2 * fVar12 + auVar50._24_4_;
              auVar47._28_4_ = fVar1 + auVar50._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x18))->_vptr_Allocator +
                                lVar40 + lVar36);
              fVar2 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x18))->_vptr_Allocator +
                                lVar40 + lVar36 + 4);
              auVar45._0_4_ = fVar1 * fVar3 + auVar44._0_4_;
              auVar45._4_4_ = fVar1 * fVar4 + auVar44._4_4_;
              auVar45._8_4_ = fVar1 * fVar8 + auVar44._8_4_;
              auVar45._12_4_ = fVar1 * fVar9 + auVar44._12_4_;
              auVar45._16_4_ = fVar1 * fVar10 + auVar44._16_4_;
              auVar45._20_4_ = fVar1 * fVar11 + auVar44._20_4_;
              auVar45._24_4_ = fVar1 * fVar12 + auVar44._24_4_;
              auVar45._28_4_ = fVar1 + auVar44._28_4_;
              auVar42._0_4_ = fVar2 * fVar3 + auVar43._0_4_;
              auVar42._4_4_ = fVar2 * fVar4 + auVar43._4_4_;
              auVar42._8_4_ = fVar2 * fVar8 + auVar43._8_4_;
              auVar42._12_4_ = fVar2 * fVar9 + auVar43._12_4_;
              auVar42._16_4_ = fVar2 * fVar10 + auVar43._16_4_;
              auVar42._20_4_ = fVar2 * fVar11 + auVar43._20_4_;
              auVar42._24_4_ = fVar2 * fVar12 + auVar43._24_4_;
              auVar42._28_4_ = pfVar31[7] + auVar43._28_4_;
              lVar40 = lVar40 + 0x20;
              iVar39 = iVar39 + -1;
              auVar50 = auVar47;
              auVar48 = auVar49;
              auVar46 = auVar51;
              auVar43 = auVar42;
              auVar44 = auVar45;
              auVar16 = auVar52;
              auVar17 = auVar53;
              auVar18 = auVar54;
            } while (iVar39 != 0);
          }
          *pauVar37 = auVar54;
          pauVar37[1] = auVar53;
          pauVar37[2] = auVar52;
          pauVar37[3] = auVar51;
          pauVar37[4] = auVar49;
          pauVar37[5] = auVar47;
          pauVar37[6] = auVar45;
          pauVar37[7] = auVar42;
          pauVar37 = pauVar37 + 8;
          uVar30 = uVar34 + 8;
          lVar36 = uVar34 + 0xf;
          lVar26 = lVar26 + 1;
          uVar34 = uVar30;
        } while (lVar36 < (long)uVar25);
      }
      if ((int)((uint)uVar30 | 3) < (int)uVar5) {
        uVar29 = 0;
        do {
          auVar50 = *(undefined1 (*) [32])ppvVar28;
          iVar39 = (int)uVar30;
          auVar48 = auVar50;
          auVar46 = auVar50;
          auVar43 = auVar50;
          if (0 < iVar24) {
            lVar26 = local_78 * local_b8._16_8_ *
                     (ulong)((uVar29 & 1) + ((uint)(uVar30 >> 3) & 0x1fffffff));
            lVar36 = 0;
            iVar41 = iVar24;
            auVar51 = auVar50;
            auVar49 = auVar50;
            auVar47 = auVar50;
            auVar54 = auVar50;
            do {
              pfVar31 = (float *)((long)kernel->data +
                                 lVar36 * 2 + kernel->cstep * uVar22 * kernel->elemsize);
              fVar8 = *pfVar31;
              fVar9 = pfVar31[1];
              fVar10 = pfVar31[2];
              fVar11 = pfVar31[3];
              fVar12 = pfVar31[4];
              fVar13 = pfVar31[5];
              fVar14 = pfVar31[6];
              fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar36 + lVar26);
              fVar2 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar36 + lVar26 + 4);
              fVar3 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                                lVar36 + lVar26);
              fVar4 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                                lVar36 + lVar26 + 4);
              auVar50._0_4_ = fVar1 * fVar8 + auVar49._0_4_;
              auVar50._4_4_ = fVar1 * fVar9 + auVar49._4_4_;
              auVar50._8_4_ = fVar1 * fVar10 + auVar49._8_4_;
              auVar50._12_4_ = fVar1 * fVar11 + auVar49._12_4_;
              auVar50._16_4_ = fVar1 * fVar12 + auVar49._16_4_;
              auVar50._20_4_ = fVar1 * fVar13 + auVar49._20_4_;
              auVar50._24_4_ = fVar1 * fVar14 + auVar49._24_4_;
              auVar50._28_4_ = fVar1 + auVar49._28_4_;
              auVar48._0_4_ = fVar2 * fVar8 + auVar51._0_4_;
              auVar48._4_4_ = fVar2 * fVar9 + auVar51._4_4_;
              auVar48._8_4_ = fVar2 * fVar10 + auVar51._8_4_;
              auVar48._12_4_ = fVar2 * fVar11 + auVar51._12_4_;
              auVar48._16_4_ = fVar2 * fVar12 + auVar51._16_4_;
              auVar48._20_4_ = fVar2 * fVar13 + auVar51._20_4_;
              auVar48._24_4_ = fVar2 * fVar14 + auVar51._24_4_;
              auVar48._28_4_ = fVar1 + auVar51._28_4_;
              auVar46._0_4_ = fVar3 * fVar8 + auVar54._0_4_;
              auVar46._4_4_ = fVar3 * fVar9 + auVar54._4_4_;
              auVar46._8_4_ = fVar3 * fVar10 + auVar54._8_4_;
              auVar46._12_4_ = fVar3 * fVar11 + auVar54._12_4_;
              auVar46._16_4_ = fVar3 * fVar12 + auVar54._16_4_;
              auVar46._20_4_ = fVar3 * fVar13 + auVar54._20_4_;
              auVar46._24_4_ = fVar3 * fVar14 + auVar54._24_4_;
              auVar46._28_4_ = fVar1 + auVar54._28_4_;
              auVar43._0_4_ = fVar4 * fVar8 + auVar47._0_4_;
              auVar43._4_4_ = fVar4 * fVar9 + auVar47._4_4_;
              auVar43._8_4_ = fVar4 * fVar10 + auVar47._8_4_;
              auVar43._12_4_ = fVar4 * fVar11 + auVar47._12_4_;
              auVar43._16_4_ = fVar4 * fVar12 + auVar47._16_4_;
              auVar43._20_4_ = fVar4 * fVar13 + auVar47._20_4_;
              auVar43._24_4_ = fVar4 * fVar14 + auVar47._24_4_;
              auVar43._28_4_ = pfVar31[7] + auVar47._28_4_;
              lVar36 = lVar36 + 0x10;
              iVar41 = iVar41 + -1;
              auVar51 = auVar48;
              auVar49 = auVar50;
              auVar47 = auVar43;
              auVar54 = auVar46;
            } while (iVar41 != 0);
          }
          *pauVar37 = auVar50;
          pauVar37[1] = auVar48;
          pauVar37[2] = auVar46;
          pauVar37[3] = auVar43;
          pauVar37 = pauVar37 + 4;
          uVar19 = iVar39 + 4;
          uVar34 = (ulong)uVar19;
          uVar29 = (uint)(byte)((char)uVar29 + 1);
          uVar30 = (ulong)uVar19;
        } while (iVar39 + 7 < (int)uVar5);
      }
      else {
        uVar34 = uVar30 & 0xffffffff;
      }
      if ((int)uVar34 < (int)uVar5) {
        do {
          uVar29 = (uint)uVar34;
          auVar44 = *(undefined1 (*) [32])ppvVar28;
          if (0 < iVar24) {
            pfVar31 = (float *)(kernel->cstep * uVar22 * kernel->elemsize + (long)kernel->data);
            lVar26 = 0;
            auVar51 = auVar44;
            do {
              fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ +
                                lVar26 * 4 +
                                local_78 * local_b8._16_8_ *
                                (ulong)((uVar29 & 3) + (int)(uVar34 >> 3) +
                                       (uint)((uVar29 >> 2 & 1) != 0)));
              auVar44._0_4_ = fVar1 * *pfVar31 + auVar51._0_4_;
              auVar44._4_4_ = fVar1 * pfVar31[1] + auVar51._4_4_;
              auVar44._8_4_ = fVar1 * pfVar31[2] + auVar51._8_4_;
              auVar44._12_4_ = fVar1 * pfVar31[3] + auVar51._12_4_;
              auVar44._16_4_ = fVar1 * pfVar31[4] + auVar51._16_4_;
              auVar44._20_4_ = fVar1 * pfVar31[5] + auVar51._20_4_;
              auVar44._24_4_ = fVar1 * pfVar31[6] + auVar51._24_4_;
              auVar44._28_4_ = fVar1 + auVar51._28_4_;
              pfVar31 = pfVar31 + 8;
              lVar26 = lVar26 + 1;
              auVar51 = auVar44;
            } while (iVar24 != (int)lVar26);
          }
          *pauVar37 = auVar44;
          pauVar37 = pauVar37 + 1;
          uVar34 = (ulong)(uVar29 + 1);
        } while (uVar29 + 1 != uVar5);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != local_70);
  }
  piVar15 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_b8._0_8_ != (Allocator *)0x0) {
          free((void *)local_b8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_b8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to8_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _r0 = _mm256_loadu_ps(img0);
                    _mm256_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 8 * 2, _sum2);
            _mm256_store_ps(outptr0 + 8 * 3, _sum3);
            _mm256_store_ps(outptr0 + 8 * 4, _sum4);
            _mm256_store_ps(outptr0 + 8 * 5, _sum5);
            _mm256_store_ps(outptr0 + 8 * 6, _sum6);
            _mm256_store_ps(outptr0 + 8 * 7, _sum7);
            outptr0 += 64;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);

                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 16, _sum2);
            _mm256_store_ps(outptr0 + 24, _sum3);
            outptr0 += 32;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);
                __m256 _val = _mm256_broadcast_ss(tmpptr);
                _sum = _mm256_comp_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum);
            outptr0 += 8;
        }
    }
}